

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O3

size_t absl::lts_20250127::log_internal::FormatLogPrefix
                 (LogSeverity severity,Time timestamp,Tid tid,string_view basename,int line,
                 PrefixFormat format,Span<char> *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  Duration num;
  uint uVar3;
  TimeZone *this;
  Nonnull<char_*> pcVar4;
  ulong uVar5;
  undefined8 extraout_RAX;
  undefined4 in_register_0000000c;
  uint *puVar6;
  char *pcVar7;
  uint *puVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  undefined8 extraout_RDX_01;
  byte *extraout_RDX_02;
  LogSeverity unaff_EBP;
  int64_t iVar10;
  uint *size;
  string *__return_storage_ptr__;
  char *pcVar11;
  Duration *__n;
  Duration *pDVar12;
  uint *puVar13;
  HiRep this_00;
  uint *puVar14;
  ulong unaff_R15;
  Time t;
  UntypedFormatSpecImpl format_00;
  timeval tVar15;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  CivilInfo ci;
  ulong uStackY_160;
  code *pcStackY_158;
  ulong uStackY_150;
  code *pcStackY_148;
  ulong uStackY_140;
  code *pcStackY_138;
  ulong uStackY_130;
  code *pcStackY_128;
  ulong uStackY_120;
  code *pcStackY_118;
  ulong uStackY_110;
  code *pcStackY_108;
  undefined8 uStackY_100;
  code *pcStackY_f8;
  ulong uStackY_f0;
  code *pcStackY_e8;
  HiRep HStackY_e0;
  code *pcStackY_d8;
  ulong uStackY_d0;
  code *pcStackY_c8;
  undefined8 uStackY_c0;
  code *pcStackY_b8;
  int_least8_t iStackY_b0;
  int_least8_t iStackY_af;
  int_least8_t iStackY_ae;
  int_least8_t iStackY_ad;
  int_least8_t iStackY_ac;
  undefined3 uStackY_ab;
  code *pcStackY_a8;
  code *pcStackY_a0;
  uint *puStack_90;
  uint *local_88;
  uint *local_80;
  int local_78;
  uint local_74;
  Duration local_70;
  undefined4 uStack_64;
  CivilInfo local_60;
  
  puVar6 = (uint *)CONCAT44(in_register_0000000c,tid);
  puVar8 = (uint *)basename._M_str;
  __n = (Duration *)basename._M_len;
  this_00 = timestamp.rep_.rep_hi_;
  pDVar12 = __n;
  puVar13 = puVar8;
  if (buf->len_ < 0x22) {
    buf->len_ = 0;
    goto LAB_002affc2;
  }
  unaff_R15 = (ulong)timestamp.rep_.rep_lo_;
  pcStackY_a0 = (code *)0x2afc09;
  this = TimeZone();
  uVar9 = extraout_RDX;
  puVar14 = puVar8;
  local_88 = puVar6;
  if (this == (TimeZone *)0x0) goto LAB_002aff2b;
  pcVar11 = buf->ptr_;
  if (severity < 4) {
    pcVar7 = (&PTR_anon_var_dwarf_ab5e67_00457cb8)[severity];
  }
  else {
    pcVar7 = "UNKNOWN";
  }
  *pcVar11 = *pcVar7;
  pcStackY_a0 = (code *)0x2afc55;
  lts_20250127::TimeZone::At(&local_60,this,timestamp);
  pcStackY_a0 = (code *)0x2afc61;
  numbers_internal::PutTwoDigits((int)local_60.cs.f_.m,pcVar11 + 1);
  pcStackY_a0 = (code *)0x2afc6e;
  numbers_internal::PutTwoDigits((int)local_60.cs.f_.d,pcVar11 + 3);
  pcVar11[5] = ' ';
  pcStackY_a0 = (code *)0x2afc80;
  numbers_internal::PutTwoDigits((int)local_60.cs.f_.hh,pcVar11 + 6);
  pcVar11[8] = ':';
  pcStackY_a0 = (code *)0x2afc94;
  numbers_internal::PutTwoDigits((int)local_60.cs.f_.mm,pcVar11 + 9);
  pcVar11[0xb] = ':';
  pcStackY_a0 = (code *)0x2afca5;
  numbers_internal::PutTwoDigits((int)local_60.cs.f_.ss,pcVar11 + 0xc);
  pcVar11[0xe] = '.';
  num.rep_lo_ = local_60.subsecond.rep_lo_;
  num.rep_hi_ = local_60.subsecond.rep_hi_;
  if ((ulong)local_60.subsecond.rep_hi_ >> 0x2b == 0) {
    iVar10 = (ulong)local_60.subsecond.rep_lo_ / 4000 + (long)local_60.subsecond.rep_hi_ * 1000000;
  }
  else {
    pDVar12 = &local_70;
    local_70.rep_hi_ = local_60.subsecond.rep_hi_;
    local_70.rep_lo_ = local_60.subsecond.rep_lo_;
    pcStackY_a0 = (code *)0x2afcef;
    iVar10 = IDivDuration(num,(Duration)(ZEXT412(4000) << 0x40),pDVar12);
  }
  pcStackY_a0 = (code *)0x2afd17;
  numbers_internal::PutTwoDigits
            ((int)(SUB168(SEXT816(iVar10) * SEXT816(0x346dc5d63886594b),8) >> 0xb) -
             (SUB164(SEXT816(iVar10) * SEXT816(0x346dc5d63886594b),0xc) >> 0x1f),pcVar11 + 0xf);
  unaff_R15 = iVar10 / 100;
  pcStackY_a0 = (code *)0x2afd62;
  numbers_internal::PutTwoDigits
            ((int)unaff_R15 +
             ((int)(SUB168(SEXT816((long)unaff_R15) * ZEXT816(0xa3d70a3d70a3d70b),8) >> 6) -
             (SUB164(SEXT816((long)unaff_R15) * ZEXT816(0xa3d70a3d70a3d70b),0xc) >> 0x1f)) * -100,
             pcVar11 + 0x11);
  severity = (int)iVar10 + (int)unaff_R15 * -100;
  pcStackY_a0 = (code *)0x2afd73;
  numbers_internal::PutTwoDigits(severity,pcVar11 + 0x13);
  pcVar11[0x15] = ' ';
  if ((uint)tid < 10) {
    pcVar11[0x16] = ' ';
    puVar14 = (uint *)(pcVar11 + 0x17);
LAB_002afda5:
    *(undefined1 *)puVar14 = 0x20;
    puVar14 = (uint *)((long)puVar14 + 1);
LAB_002afdad:
    *(undefined1 *)puVar14 = 0x20;
    puVar14 = (uint *)((long)puVar14 + 1);
LAB_002afdb5:
    *(undefined1 *)puVar14 = 0x20;
    puVar14 = (uint *)((long)puVar14 + 1);
LAB_002afdbd:
    *(undefined1 *)puVar14 = 0x20;
    puVar14 = (uint *)((long)puVar14 + 1);
  }
  else {
    puVar14 = (uint *)(pcVar11 + 0x16);
    if (tid + 9U < 0x6d) goto LAB_002afda5;
    if (tid + 99U < 1099) goto LAB_002afdad;
    if (tid + 999U < 10999) goto LAB_002afdb5;
    if (tid + 9999U < 109999) goto LAB_002afdbd;
    if (0x10c8de < tid + 99999U) goto LAB_002afdcd;
  }
  *(undefined1 *)puVar14 = 0x20;
  puVar14 = (uint *)((long)puVar14 + 1);
LAB_002afdcd:
  pcStackY_a0 = (code *)0x2afdd5;
  size = puVar14;
  pcVar4 = numbers_internal::FastIntToBuffer(tid,(Nonnull<char_*>)puVar14);
  *pcVar4 = ' ';
  this_00 = (HiRep)((long)pcVar4 + (1 - (long)buf->ptr_));
  local_80 = puVar8;
  if (buf->len_ < (ulong)this_00) {
    pcStackY_a0 = (code *)0x2aff74;
    FormatLogPrefix();
    goto LAB_002aff74;
  }
  buf->ptr_ = buf->ptr_ + (long)this_00;
  buf->len_ = buf->len_ - (long)this_00;
  do {
    if ((Duration *)buf->len_ < __n) {
      __n = (Duration *)buf->len_;
    }
    pcStackY_a0 = (code *)0x2afe19;
    memcpy(buf->ptr_,puVar8,(size_t)__n);
    uVar5 = (long)buf->len_ - (long)__n;
    puVar14 = puVar8;
    if ((Duration *)buf->len_ < __n) {
      pcStackY_a0 = (code *)0x2aff2b;
      FormatLogPrefix();
      uVar9 = extraout_RDX_00;
LAB_002aff2b:
      t.rep_.rep_hi_ = (HiRep)(unaff_R15 & 0xffffffff);
      pcStackY_a0 = (code *)0x2aff36;
      t.rep_.rep_lo_ = (uint32_t)uVar9;
      tVar15 = ToTimeval((lts_20250127 *)this_00,t);
      auVar2 = tVar15._0_12_;
      puVar6 = (uint *)buf->ptr_;
      size = (uint *)buf->len_;
      local_60.cs.f_.y = 0x3af5f6;
      local_60.cs.f_.m = '\x1b';
      local_60.cs.f_.d = '\0';
      local_60.cs.f_.hh = '\0';
      local_60.cs.f_.mm = '\0';
      local_60.cs.f_.ss = '\0';
      local_60.cs.f_._13_3_ = 0;
      if (kFatal < severity) goto LAB_002aff79;
      pcVar11 = (&PTR_anon_var_dwarf_ab5e67_00457cb8)[severity];
      puVar8 = puVar14;
    }
    else {
      __return_storage_ptr__ = (string *)(buf->ptr_ + (long)&(__n->rep_hi_).lo_);
      buf->ptr_ = (pointer)__return_storage_ptr__;
      buf->len_ = uVar5;
      if (uVar5 < 0xe) {
        puVar8 = (uint *)0x0;
        pcVar4 = (Nonnull<char_*>)0x0;
        goto LAB_002afe71;
      }
      puVar6 = (uint *)(ulong)(uint)line;
      *(char *)&(__return_storage_ptr__->_M_dataplus)._M_p = ':';
      pcStackY_a0 = (code *)0x2afe4f;
      pcVar4 = numbers_internal::FastIntToBuffer
                         (line,(Nonnull<char_*>)
                               ((long)&(__return_storage_ptr__->_M_dataplus)._M_p + 1));
      pcVar4[0] = ']';
      pcVar4[1] = ' ';
      size = (uint *)buf->ptr_;
      pcVar4 = pcVar4 + (2 - (long)size);
      puVar8 = (uint *)((Nonnull<char_*>)buf->len_ + -(long)pcVar4);
      if (pcVar4 <= (Nonnull<char_*>)buf->len_) {
        __return_storage_ptr__ = (string *)((long)size + (long)pcVar4);
        buf->ptr_ = (pointer)__return_storage_ptr__;
LAB_002afe71:
        pcVar4 = pcVar4 + (long)this_00 + (long)&(__n->rep_hi_).lo_;
        buf->len_ = (size_type)puVar8;
        if (format == kRaw) {
          puVar6 = (uint *)0x5;
          if (puVar8 < (uint *)0x5) {
            puVar6 = puVar8;
          }
          pcVar11 = "RAW: ";
          pcStackY_a0 = (code *)0x2afeaa;
          memcpy(__return_storage_ptr__,"RAW: ",(size_t)puVar6);
          if ((uint *)buf->len_ < puVar6) {
            pcStackY_a0 = 
            StrFormat<char,_int,_int,_int,_int,_int,_long,_int,_std::basic_string_view<char,_std::char_traits<char>_>,_int,_const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ;
            FormatLogPrefix();
            uStackY_160 = (ulong)*extraout_RDX_02;
            pcStackY_158 = str_format_internal::FormatArgImpl::Dispatch<char>;
            uStackY_150 = (ulong)*puVar8;
            pcStackY_148 = str_format_internal::FormatArgImpl::Dispatch<int>;
            uStackY_140 = (ulong)(pDVar12->rep_hi_).lo_;
            pcStackY_138 = str_format_internal::FormatArgImpl::Dispatch<int>;
            uStackY_130 = (ulong)*puVar13;
            pcStackY_128 = str_format_internal::FormatArgImpl::Dispatch<int>;
            uStackY_120 = (ulong)*puStack_90;
            pcStackY_118 = str_format_internal::FormatArgImpl::Dispatch<int>;
            uStackY_110 = (ulong)*local_88;
            pcStackY_108 = str_format_internal::FormatArgImpl::Dispatch<int>;
            uStackY_100 = *(undefined8 *)local_80;
            pcStackY_f8 = str_format_internal::FormatArgImpl::Dispatch<long>;
            uStackY_f0 = (ulong)*(uint *)CONCAT44(local_74,local_78);
            pcStackY_e8 = str_format_internal::FormatArgImpl::Dispatch<int>;
            HStackY_e0 = local_70.rep_hi_;
            pcStackY_d8 = str_format_internal::FormatArgImpl::
                          Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
            uStackY_d0 = (ulong)*(uint *)CONCAT44(uStack_64,local_70.rep_lo_);
            pcStackY_c8 = str_format_internal::FormatArgImpl::Dispatch<int>;
            uStackY_c0 = *(undefined8 *)local_60.cs.f_.y;
            pcStackY_b8 = str_format_internal::FormatArgImpl::Dispatch<char_const*>;
            iStackY_b0 = local_60.cs.f_.m;
            iStackY_af = local_60.cs.f_.d;
            iStackY_ae = local_60.cs.f_.hh;
            iStackY_ad = local_60.cs.f_.mm;
            iStackY_ac = local_60.cs.f_.ss;
            uStackY_ab = local_60.cs.f_._13_3_;
            pcStackY_a8 = str_format_internal::FormatArgImpl::
                          Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
            format_00.size_ = (size_t)&uStackY_160;
            format_00.data_ = *(void **)(pcVar11 + 8);
            args.len_ = (size_type)puVar13;
            args.ptr_ = (pointer)0xc;
            pcStackY_a0 = (code *)pcVar4;
            str_format_internal::FormatPack_abi_cxx11_
                      (__return_storage_ptr__,*(str_format_internal **)pcVar11,format_00,args);
            return (size_t)__return_storage_ptr__;
          }
          buf->ptr_ = buf->ptr_ + (long)puVar6;
          buf->len_ = (long)buf->len_ - (long)puVar6;
          pcVar4 = pcVar4 + (long)puVar6;
        }
        return (size_t)pcVar4;
      }
LAB_002aff74:
      pcStackY_a0 = (code *)0x2aff79;
      FormatLogPrefix();
      auVar1._8_8_ = extraout_RDX_01;
      auVar1._0_8_ = extraout_RAX;
      auVar2 = auVar1._0_12_;
LAB_002aff79:
      pcVar11 = "UNKNOWN";
      puVar8 = puVar14;
    }
    pDVar12 = &local_70;
    local_70.rep_hi_.lo_ = auVar2._0_4_;
    puVar13 = &local_74;
    local_74 = auVar2._8_4_;
    local_78 = (int)local_88;
    pcStackY_a0 = (code *)0x2affab;
    uVar3 = SNPrintF<char,_int,_int,_int>
                      ((Nonnull<char_*>)puVar6,(size_t)size,
                       (FormatSpec<char,_int,_int,_int> *)&local_60,pcVar11,(int *)pDVar12,
                       (int *)puVar13,&local_78);
    unaff_EBP = severity;
    if ((int)uVar3 < 0) {
LAB_002affc2:
      this_00.lo_ = 0;
      this_00.hi_ = 0;
      severity = unaff_EBP;
    }
    else {
      this_00.hi_ = 0;
      this_00.lo_ = uVar3;
      pcStackY_a0 = (code *)0x2affbd;
      Span<char>::remove_prefix(buf,(size_type)this_00);
    }
  } while( true );
}

Assistant:

size_t FormatLogPrefix(absl::LogSeverity severity, absl::Time timestamp,
                       log_internal::Tid tid, absl::string_view basename,
                       int line, PrefixFormat format, absl::Span<char>& buf) {
  auto prefix_size = FormatBoundedFields(severity, timestamp, tid, buf);
  prefix_size += log_internal::AppendTruncated(basename, buf);
  prefix_size += FormatLineNumber(line, buf);
  if (format == PrefixFormat::kRaw)
    prefix_size += log_internal::AppendTruncated("RAW: ", buf);
  return prefix_size;
}